

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O3

void __thiscall EmmyFacade::~EmmyFacade(EmmyFacade *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Manager_type p_Var1;
  
  EmmyDebuggerManager::~EmmyDebuggerManager(&this->_emmyDebuggerManager);
  std::
  _Rb_tree<lua_State_*,_lua_State_*,_std::_Identity<lua_State_*>,_std::less<lua_State_*>,_std::allocator<lua_State_*>_>
  ::~_Rb_tree(&(this->mainStates)._M_t);
  this_00 = (this->transporter).super___shared_ptr<Transporter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  std::condition_variable::~condition_variable(&this->waitIDECV);
  p_Var1 = (this->StartHook).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

EmmyFacade::~EmmyFacade() {
}